

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

void get_2d_footprint_cells
               (vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *polygon,
               set<sbpl_2Dcell_t,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_> *cells,
               sbpl_xy_theta_pt_t pose,double res)

{
  uint uVar1;
  uint sx;
  pointer psVar2;
  int **grid;
  ulong uVar3;
  int *__s;
  pair<int,_int> *ppVar4;
  int iVar5;
  pair<int,_int> *ppVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  double in_XMM0_Qb;
  undefined1 auVar24 [16];
  double extraout_XMM0_Qb;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> disc_polygon;
  sbpl_bfs_2d bfs;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_148;
  uint local_12c;
  _Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
  *local_128;
  double dStack_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  int local_ec;
  sbpl_bfs_2d local_e8;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  sbpl_2Dcell_t local_90;
  double local_88;
  ulong local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  int **local_48;
  ulong local_40;
  ulong local_38;
  
  if ((ulong)((long)(polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>)._M_impl
                    .super__Vector_impl_data._M_finish -
             (long)(polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>)._M_impl.
                   super__Vector_impl_data._M_start) < 0x11) {
    auVar24._8_8_ = res;
    auVar24._0_8_ = res;
    auVar26 = divpd(pose._0_16_,auVar24);
    local_e8.dist_ =
         (int **)CONCAT44((int)auVar26._8_8_ - (uint)(pose.y < 0.0),
                          (int)auVar26._0_8_ - (uint)(pose.x < 0.0));
    std::
    _Rb_tree<sbpl_2Dcell_t,sbpl_2Dcell_t,std::_Identity<sbpl_2Dcell_t>,std::less<sbpl_2Dcell_t>,std::allocator<sbpl_2Dcell_t>>
    ::_M_insert_unique<sbpl_2Dcell_t_const&>
              ((_Rb_tree<sbpl_2Dcell_t,sbpl_2Dcell_t,std::_Identity<sbpl_2Dcell_t>,std::less<sbpl_2Dcell_t>,std::allocator<sbpl_2Dcell_t>>
                *)cells,(sbpl_2Dcell_t *)&local_e8);
  }
  else {
    local_b8 = pose.theta;
    local_128 = (_Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
                 *)res;
    dStack_120 = in_XMM0_Qb;
    local_a8 = cos(pose.theta);
    dStack_a0 = extraout_XMM0_Qb;
    local_88 = sin(local_b8);
    local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pair<int,_int> *)0x0;
    local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pair<int,_int> *)0x0;
    local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pair<int,_int> *)0x0;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::reserve
              (&local_148,
               ((long)(polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 4) + 1);
    psVar2 = (polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>)._M_impl.
        super__Vector_impl_data._M_finish == psVar2) {
      iVar5 = 1000000000;
      iVar13 = -1000000000;
      iVar7 = -1000000000;
      uVar10 = 1000000000;
    }
    else {
      local_b8 = -local_88;
      dStack_b0 = local_a8;
      dStack_120 = (double)local_128;
      dStack_a0 = local_88;
      iVar7 = -1000000000;
      uVar10 = 1000000000;
      iVar5 = 1000000000;
      iVar13 = -1000000000;
      uVar21 = 0;
      uVar3 = 1;
      do {
        auVar25._0_8_ = psVar2[uVar21].x * local_a8 + psVar2[uVar21].y * local_b8 + pose.x;
        auVar25._8_8_ = psVar2[uVar21].x * dStack_a0 + psVar2[uVar21].y * dStack_b0 + pose.y;
        auVar26._8_8_ = dStack_120;
        auVar26._0_8_ = local_128;
        auVar26 = divpd(auVar25,auVar26);
        local_e8.dist_._0_4_ =
             (int)((double)(-(ulong)(0.0 < auVar25._0_8_) & 0x3fe0000000000000 |
                           ~-(ulong)(0.0 < auVar25._0_8_) & 0xbfe0000000000000) + auVar26._0_8_);
        local_e8.dist_._4_4_ =
             (int)((double)(-(ulong)(0.0 < auVar25._8_8_) & 0x3fe0000000000000 |
                           ~-(ulong)(0.0 < auVar25._8_8_) & 0xbfe0000000000000) + auVar26._8_8_);
        if (local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          _M_realloc_insert<std::pair<int,int>const&>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_148,
                     (iterator)
                     local_148.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(pair<int,_int> *)&local_e8);
        }
        else {
          *local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish = (pair<int,_int>)local_e8.dist_;
          local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_148.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if ((int)local_e8.dist_ < (int)uVar10) {
          uVar10 = (ulong)local_e8.dist_ & 0xffffffff;
        }
        if (iVar7 < (int)local_e8.dist_) {
          iVar7 = (int)local_e8.dist_;
        }
        if (local_e8.dist_._4_4_ < iVar5) {
          iVar5 = local_e8.dist_._4_4_;
        }
        if (iVar13 < local_e8.dist_._4_4_) {
          iVar13 = local_e8.dist_._4_4_;
        }
        psVar2 = (polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        bVar23 = uVar3 < (ulong)((long)(polygon->
                                       super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >>
                                4);
        uVar21 = uVar3;
        uVar3 = (ulong)((int)uVar3 + 1);
      } while (bVar23);
    }
    if (local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      _M_realloc_insert<std::pair<int,int>const&>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_148,
                 (iterator)
                 local_148.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 local_148.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    }
    else {
      *local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           *local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    uVar19 = iVar7 - (int)uVar10;
    sx = uVar19 + 3;
    uVar21 = 0xffffffffffffffff;
    if (-4 < (int)uVar19) {
      uVar21 = (long)(int)sx << 3;
    }
    grid = (int **)operator_new__(uVar21);
    uVar18 = iVar13 - iVar5;
    local_110 = (ulong)uVar18;
    local_12c = uVar18 + 3;
    if (-3 < (int)uVar19) {
      uVar21 = 0xffffffffffffffff;
      if (-4 < (int)uVar18) {
        uVar21 = (long)(int)local_12c * 4;
      }
      uVar3 = 1;
      if (1 < (int)local_12c) {
        uVar3 = (ulong)local_12c;
      }
      local_128 = (_Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
                   *)(uVar3 << 2);
      uVar3 = 1;
      if (1 < (int)sx) {
        uVar3 = (ulong)sx;
      }
      uVar20 = 0;
      do {
        __s = (int *)operator_new__(uVar21);
        grid[uVar20] = __s;
        if (-3 < (int)local_110) {
          memset(__s,0,(size_t)local_128);
        }
        uVar20 = uVar20 + 1;
      } while (uVar3 != uVar20);
    }
    local_128 = &cells->_M_t;
    local_118 = uVar10;
    local_f8 = (ulong)uVar19;
    if (8 < (ulong)((long)local_148.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_148.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
      local_100 = (ulong)((int)uVar10 - 1);
      local_108 = (ulong)(iVar5 - 1);
      uVar21 = 1;
      ppVar4 = local_148.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppVar6 = local_148.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      do {
        uVar18 = (int)uVar21 - 1;
        iVar13 = ppVar4[uVar18].first - (int)uVar10;
        uVar19 = iVar13 + 1;
        iVar7 = ppVar4[uVar18].second - iVar5;
        iVar14 = ppVar4[uVar21].first - (int)uVar10;
        uVar18 = iVar14 + 1;
        iVar16 = ppVar4[uVar21].second - iVar5;
        uVar1 = iVar16 + 1;
        uVar17 = iVar16 - iVar7;
        uVar8 = iVar7 + 1;
        uVar12 = -uVar17;
        if (0 < (int)uVar17) {
          uVar12 = uVar17;
        }
        uVar15 = iVar14 - iVar13;
        uVar17 = -uVar15;
        if (0 < (int)uVar15) {
          uVar17 = uVar15;
        }
        local_a8 = (double)CONCAT44(local_a8._4_4_,uVar12);
        local_b8 = (double)CONCAT44(local_b8._4_4_,uVar17);
        uVar15 = uVar19;
        uVar11 = uVar18;
        if (uVar17 < uVar12) {
          uVar15 = uVar8;
          uVar11 = uVar1;
          uVar8 = uVar19;
          uVar1 = uVar18;
        }
        uVar18 = uVar1;
        uVar12 = uVar15;
        uVar19 = uVar11;
        if ((int)uVar11 < (int)uVar15) {
          uVar18 = uVar8;
          uVar12 = uVar11;
          uVar19 = uVar15;
          uVar8 = uVar1;
        }
        iVar13 = uVar18 - uVar8;
        bVar23 = iVar13 != 0 && (int)uVar8 <= (int)uVar18;
        iVar7 = -iVar13;
        if (0 < iVar13) {
          iVar7 = iVar13;
        }
        local_88 = (double)CONCAT44(local_88._4_4_,iVar7);
        if ((int)uVar12 <= (int)uVar19) {
          iVar7 = (int)(uVar19 - uVar12) / 2;
          if ((int)uVar11 < (int)uVar15) {
            uVar15 = uVar11;
          }
          local_68 = (ulong)((bVar23 - 1) + (uint)bVar23);
          lVar22 = (long)(int)uVar15;
          local_48 = grid + lVar22;
          local_50 = lVar22 * 4;
          local_58 = (ulong)((int)local_100 + uVar15);
          local_60 = (ulong)((int)local_108 + uVar15);
          local_38 = (ulong)((uVar19 - uVar12) + 1);
          lVar9 = 0;
          local_ec = uVar19 - uVar12;
          local_78 = uVar21;
          local_70 = lVar22;
          local_40 = (ulong)uVar19;
          do {
            iVar13 = (int)lVar9;
            if (local_b8._0_4_ < local_a8._0_4_) {
              *(undefined4 *)((long)grid[(int)uVar8] + lVar9 * 4 + local_50) = 1;
              local_e8.dist_ = (int **)CONCAT44((int)local_60 + iVar13,(int)local_100 + uVar8);
              std::
              _Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
              ::_M_insert_unique<sbpl_2Dcell_t>(&cells->_M_t,(sbpl_2Dcell_t *)&local_e8);
              iVar13 = (int)lVar22;
            }
            else {
              local_48[lVar9][(int)uVar8] = 1;
              local_e8.dist_ = (int **)CONCAT44(uVar8 + (int)local_108,(int)local_58 + iVar13);
              std::
              _Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
              ::_M_insert_unique<sbpl_2Dcell_t>(&cells->_M_t,(sbpl_2Dcell_t *)&local_e8);
              iVar13 = (int)local_70 + iVar13;
            }
            iVar14 = iVar7 - local_88._0_4_;
            if ((iVar14 < 0) && (iVar13 != (int)local_40)) {
              uVar19 = (int)local_68 + uVar8;
              bVar23 = iVar7 + iVar14 < 0;
              if (SBORROW4(iVar7,-iVar14) != bVar23) {
                uVar8 = uVar19;
              }
              iVar13 = iVar13 + (uint)(SBORROW4(iVar7,-iVar14) == bVar23);
              if (local_b8._0_4_ < local_a8._0_4_) {
                grid[(int)uVar8][iVar13] = 1;
                local_e8.dist_ = (int **)CONCAT44(iVar13 + (int)local_108,uVar8 + (int)local_100);
                std::
                _Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
                ::_M_insert_unique<sbpl_2Dcell_t>(local_128,(sbpl_2Dcell_t *)&local_e8);
              }
              else {
                grid[iVar13][(int)uVar8] = 1;
                local_e8.dist_ = (int **)CONCAT44(uVar8 + (int)local_108,iVar13 + (int)local_100);
                std::
                _Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
                ::_M_insert_unique<sbpl_2Dcell_t>(local_128,(sbpl_2Dcell_t *)&local_e8);
              }
              iVar14 = iVar14 + local_ec;
              uVar8 = uVar19;
            }
            iVar7 = iVar14;
            lVar22 = lVar22 + 1;
            lVar9 = lVar9 + 1;
            ppVar4 = local_148.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            ppVar6 = local_148.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            uVar10 = local_118;
            uVar21 = local_78;
            cells = (set<sbpl_2Dcell_t,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_> *)
                    local_128;
          } while ((int)local_38 != (int)lVar9);
        }
        uVar21 = (ulong)((int)uVar21 + 1);
      } while (uVar21 < (ulong)((long)ppVar6 - (long)ppVar4 >> 3));
    }
    sbpl_bfs_2d::sbpl_bfs_2d(&local_e8,sx,local_12c,1,-1);
    sbpl_bfs_2d::compute_distance_from_point(&local_e8,grid,0,0);
    iVar7 = (int)local_f8;
    if (iVar7 < -2) {
      operator_delete__(grid);
    }
    else {
      uVar10 = 1;
      if (1 < (int)sx) {
        uVar10 = (ulong)sx;
      }
      uVar21 = 0;
      do {
        if (grid[uVar21] != (int *)0x0) {
          operator_delete__(grid[uVar21]);
        }
        uVar21 = uVar21 + 1;
      } while (uVar10 != uVar21);
      operator_delete__(grid);
      if (-1 < iVar7) {
        local_118 = (ulong)((int)local_118 - 1);
        iVar13 = (int)local_110;
        local_f8 = (ulong)(iVar7 + 2);
        uVar10 = 1;
        do {
          if (-1 < (int)local_110) {
            iVar7 = (int)local_118;
            lVar9 = 0;
            do {
              if (*(int *)(*(long *)((long)local_e8.dist_ + uVar10 * 8) + 4 + lVar9 * 4) < 0) {
                local_90.y = iVar5 + (int)lVar9;
                local_90.x = iVar7 + (int)uVar10;
                std::
                _Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
                ::_M_insert_unique<sbpl_2Dcell_t>(local_128,&local_90);
              }
              lVar9 = lVar9 + 1;
            } while ((ulong)(iVar13 + 2) - 1 != lVar9);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != local_f8);
      }
    }
    sbpl_bfs_2d::~sbpl_bfs_2d(&local_e8);
    if (local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pair<int,_int> *)0x0) {
      operator_delete(local_148.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_148.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_148.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void get_2d_footprint_cells(vector<sbpl_2Dpt_t> polygon, set<sbpl_2Dcell_t>* cells, sbpl_xy_theta_pt_t pose, double res)
{
    //special case for point robot
    if (polygon.size() <= 1) {
        sbpl_2Dcell_t cell;
        cell.x = CONTXY2DISC(pose.x, res);
        cell.y = CONTXY2DISC(pose.y, res);

        cells->insert(cell);
        return;
    }

    //run bressenham line algorithm around the polygon (add them to the cells set)
    //while doing that find the min and max (x,y) and the average x and y
    double cth = cos(pose.theta);
    double sth = sin(pose.theta);

    vector<pair<int, int> > disc_polygon;
    disc_polygon.reserve(polygon.size() + 1);
    int minx = INFINITECOST;
    int maxx = -INFINITECOST;
    int miny = INFINITECOST;
    int maxy = -INFINITECOST;

    //find the bounding box of the polygon
    for (unsigned int i = 0; i < polygon.size(); i++) {
        pair<int, int> p;
        //		p.first = CONTXY2DISC(cth*polygon[i].x - sth*polygon[i].y + pose.x, res);
        double cx = (cth * polygon[i].x - sth * polygon[i].y + pose.x);
        double cy = (sth * polygon[i].x + cth * polygon[i].y + pose.y);
        p.first = (int)(cx > 0 ? cx / res + 0.5 : cx / res - 0.5); //(int)(cx / res + 0.5 * sign(c);
        //		p.second = CONTXY2DISC(sth*polygon[i].x + cth*polygon[i].y + pose.y, res);
        p.second = (int)(cy > 0 ? cy / res + 0.5 : cy / res - 0.5);//(int)(cy / res + 0.5);
        disc_polygon.push_back(p);
        if (p.first < minx) minx = p.first;
        if (p.first > maxx) maxx = p.first;
        if (p.second < miny) miny = p.second;
        if (p.second > maxy) maxy = p.second;
    }
    disc_polygon.push_back(disc_polygon.front());

    //make a grid big enough for the footprint
    int sizex = (maxx - minx + 1) + 2;
    int sizey = (maxy - miny + 1) + 2;
    int** grid = new int*[sizex];
    for (int i = 0; i < sizex; i++) {
        grid[i] = new int[sizey];
        for (int j = 0; j < sizey; j++)
            grid[i][j] = 0;
    }

    //plot line points on the grid
    for (unsigned int i = 1; i < disc_polygon.size(); i++) {
        int x0 = disc_polygon[i - 1].first - minx + 1;
        int y0 = disc_polygon[i - 1].second - miny + 1;
        int x1 = disc_polygon[i].first - minx + 1;
        int y1 = disc_polygon[i].second - miny + 1;

        //bressenham (add the line cells to the set and to a vector)
        bool steep = abs(y1 - y0) > abs(x1 - x0);
        if (steep) {
            int temp = x0;
            x0 = y0;
            y0 = temp;
            temp = x1;
            x1 = y1;
            y1 = temp;
        }
        if (x0 > x1) {
            int temp = x0;
            x0 = x1;
            x1 = temp;
            temp = y0;
            y0 = y1;
            y1 = temp;
        }
        int deltax = x1 - x0;
        int deltay = abs(y1 - y0);
        int error = deltax / 2;
        int ystep = (y0 < y1 ? 1 : -1);
        int y = y0;
        for (int x = x0; x <= x1; x++) {
            if (steep) {
                grid[y][x] = 1;
                cells->insert(sbpl_2Dcell_t(y - 1 + minx, x - 1 + miny));
            }
            else {
                grid[x][y] = 1;
                cells->insert(sbpl_2Dcell_t(x - 1 + minx, y - 1 + miny));
            }
            int last_error = error;
            error -= deltay;
            if (error < 0 && x != x1) {
                //make sure we can't have a diagonal line (the 8-connected bfs will leak through)

                int tempy = y;
                int tempx = x;
                if (last_error < -error)
                    tempy += ystep;
                else
                    tempx += 1;
                if (steep) {
                    grid[tempy][tempx] = 1;
                    cells->insert(sbpl_2Dcell_t(tempy - 1 + minx, tempx - 1 + miny));
                }
                else {
                    grid[tempx][tempy] = 1;
                    cells->insert(sbpl_2Dcell_t(tempx - 1 + minx, tempy - 1 + miny));
                }

                y += ystep;
                error += deltax;
            }
        }
    }

    //run a 2d bfs from the average (x,y)
    sbpl_bfs_2d bfs(sizex, sizey, 1);
    bfs.compute_distance_from_point(grid, 0, 0);

    for (int i = 0; i < sizex; i++)
        delete[] grid[i];
    delete[] grid;

    //add all cells expanded to the cells set
    for (int i = 1; i < sizex - 1; i++) {
        for (int j = 1; j < sizey - 1; j++) {
            if (bfs.get_distance(i, j) < 0) cells->insert(sbpl_2Dcell_t(i - 1 + minx, j - 1 + miny));
        }
    }
}